

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosDynamicBinder.cpp
# Opt level: O3

void __thiscall
adios2::helper::DynamicBinder::DynamicBinder(DynamicBinder *this,string *libName,string *libPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  pointer pcVar3;
  pointer pbVar4;
  _Head_base<0UL,_adios2::helper::DynamicBinder::Impl_*,_false> _Var5;
  long *plVar6;
  undefined8 *puVar7;
  Impl IVar8;
  ostream *poVar9;
  size_type *psVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  _Alloc_hider _Var12;
  pointer pbVar13;
  pointer *__ptr;
  pointer pbVar14;
  long lVar15;
  ulong uVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  searchedLibs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libSuffixes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libPrefixes;
  string fileName;
  stringstream errString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  string *local_290;
  string local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  pointer local_200;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  local_290 = libName;
  _Var5._M_head_impl = (Impl *)operator_new(8);
  (this->m_Impl)._M_t.
  super___uniq_ptr_impl<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::helper::DynamicBinder::Impl_*,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
  .super__Head_base<0UL,_adios2::helper::DynamicBinder::Impl_*,_false>._M_head_impl =
       _Var5._M_head_impl;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
             (char (*) [1])0x75b581);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
             (char (*) [4])0x75c566);
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
             (char (*) [1])0x75b581);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
             (char (*) [4])".so");
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  local_208 = local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (((this->m_Impl)._M_t.
         super___uniq_ptr_impl<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_adios2::helper::DynamicBinder::Impl_*,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
         .super__Head_base<0UL,_adios2::helper::DynamicBinder::Impl_*,_false>._M_head_impl)->
        m_LibraryHandle != (LibraryHandle)0x0) goto LAB_003f5700;
  }
  else {
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_1b8 + 0x10);
    pbVar13 = local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_200 = local_248.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      pbVar4 = local_248.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_248.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_248.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        IVar8.m_LibraryHandle =
             ((this->m_Impl)._M_t.
              super___uniq_ptr_impl<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_adios2::helper::DynamicBinder::Impl_*,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
              .super__Head_base<0UL,_adios2::helper::DynamicBinder::Impl_*,_false>._M_head_impl)->
             m_LibraryHandle;
      }
      else {
        do {
          pbVar14 = pbVar4 + 1;
          if (libPath->_M_string_length == 0) {
            std::operator+(&local_2d0,pbVar13,local_290);
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_2d0,(ulong)(pbVar4->_M_dataplus)._M_p);
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 == paVar11) {
              local_1a8[0]._0_8_ = paVar11->_M_allocated_capacity;
              local_1a8[0]._8_8_ = plVar6[3];
              local_1b8._0_8_ = paVar1;
            }
            else {
              local_1a8[0]._0_8_ = paVar11->_M_allocated_capacity;
              local_1b8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar6;
            }
            local_1b8._8_8_ = plVar6[1];
            *plVar6 = (long)paVar11;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._0_8_ != paVar1) {
              operator_delete((void *)local_1b8._0_8_);
            }
            _Var12._M_p = local_2d0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) goto LAB_003f5481;
          }
          else {
            local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
            pcVar3 = (libPath->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_288,pcVar3,pcVar3 + libPath->_M_string_length);
            std::__cxx11::string::append((char *)&local_288);
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_288,(ulong)(pbVar13->_M_dataplus)._M_p);
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            psVar10 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_2b0.field_2._M_allocated_capacity = *psVar10;
              local_2b0.field_2._8_8_ = plVar6[3];
            }
            else {
              local_2b0.field_2._M_allocated_capacity = *psVar10;
              local_2b0._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_2b0._M_string_length = plVar6[1];
            *plVar6 = (long)psVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2b0,(ulong)(local_290->_M_dataplus)._M_p);
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 == paVar11) {
              local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_2d0.field_2._8_8_ = puVar7[3];
            }
            else {
              local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_2d0._M_dataplus._M_p = (pointer)*puVar7;
            }
            local_2d0._M_string_length = puVar7[1];
            *puVar7 = paVar11;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2d0,(ulong)(pbVar4->_M_dataplus)._M_p);
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 == paVar11) {
              local_1a8[0]._0_8_ = paVar11->_M_allocated_capacity;
              local_1a8[0]._8_8_ = puVar7[3];
              local_1b8._0_8_ = paVar1;
            }
            else {
              local_1a8[0]._0_8_ = paVar11->_M_allocated_capacity;
              local_1b8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar7;
            }
            local_1b8._8_8_ = puVar7[1];
            *puVar7 = paVar11;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._0_8_ != paVar1) {
              operator_delete((void *)local_1b8._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
              operator_delete(local_2b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p);
            }
            adios2sys::SystemTools::ConvertToOutputPath((string *)local_1b8,&local_1f8);
            std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1b8);
            _Var12._M_p = (pointer)local_1b8._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._0_8_ != paVar1) {
LAB_003f5481:
              operator_delete(_Var12._M_p);
            }
          }
          IVar8.m_LibraryHandle = adios2sys::DynamicLoader::OpenLibrary(&local_1f8);
          ((this->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::DynamicBinder::Impl_*,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
           .super__Head_base<0UL,_adios2::helper::DynamicBinder::Impl_*,_false>._M_head_impl)->
          m_LibraryHandle = IVar8.m_LibraryHandle;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_268,&local_1f8);
          IVar8.m_LibraryHandle =
               ((this->m_Impl)._M_t.
                super___uniq_ptr_impl<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_adios2::helper::DynamicBinder::Impl_*,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
                .super__Head_base<0UL,_adios2::helper::DynamicBinder::Impl_*,_false>._M_head_impl)->
               m_LibraryHandle;
        } while ((IVar8.m_LibraryHandle == (LibraryHandle)0x0) &&
                (pbVar4 = pbVar14, pbVar14 != local_200));
      }
      if (IVar8.m_LibraryHandle != (LibraryHandle)0x0) goto LAB_003f5700;
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != local_208);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar2 = (ostream *)(local_1b8 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Unable to locate the ",0x15);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(local_290->_M_dataplus)._M_p,local_290->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," library; searched for ",0x17);
  local_2d0._M_string_length = 0x750b98;
  lVar15 = (long)local_268.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_268.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (0 < lVar15) {
    uVar16 = lVar15 + 1;
    pbVar13 = local_268.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_2d0._M_dataplus._M_p = (pointer)poVar2;
    do {
      std::
      ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
      ::operator=((ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
                   *)&local_2d0,pbVar13);
      pbVar13 = pbVar13 + 1;
      uVar16 = uVar16 - 1;
    } while (1 < uVar16);
  }
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Helper","");
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"adiosDynamicBinder","");
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"DynamicBinder","");
  std::__cxx11::stringbuf::str();
  Throw<std::runtime_error>(&local_2d0,&local_2b0,&local_288,&local_1d8,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
LAB_003f5700:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  return;
}

Assistant:

DynamicBinder::DynamicBinder(std::string libName, std::string libPath) : m_Impl(new Impl)
{
    std::vector<std::string> libPrefixes;
    libPrefixes.emplace_back("");
    libPrefixes.emplace_back("lib");
#ifdef __CYGWIN__
    libPrefixes.emplace_back("cyg");
#endif

    std::vector<std::string> libSuffixes;
    libSuffixes.emplace_back("");
#ifdef __APPLE__
    libSuffixes.emplace_back(".dylib");
    libSuffixes.emplace_back(".so");
#endif
#ifdef __hpux
    libSuffixes.emplace_back(".sl");
#endif
#ifdef __unix__
    libSuffixes.emplace_back(".so");
#endif
#ifdef _WIN32
    libSuffixes.emplace_back(".dll");
#endif

    std::vector<std::string> searchedLibs;
    std::string fileName;

    // Test the various combinations of library names
    for (const std::string &prefix : libPrefixes)
    {
        for (const std::string &suffix : libSuffixes)
        {
            if (!libPath.empty())
            {
                fileName = libPath + "/" + prefix + libName + suffix;
                // Slashes in fileName is correct for unix-like systems
                // ConvertToOutputPath() will change slashes if we're running on
                // a Windows system
                fileName = adios2sys::SystemTools::ConvertToOutputPath(fileName);
            }
            else
            {
                fileName = prefix + libName + suffix;
            }
            m_Impl->m_LibraryHandle = adios2sys::DynamicLoader::OpenLibrary(fileName);
            searchedLibs.push_back(fileName);
            if (m_Impl->m_LibraryHandle)
            {
                break;
            }
        }
        if (m_Impl->m_LibraryHandle)
        {
            break;
        }
    }
    if (!m_Impl->m_LibraryHandle)
    {
        std::stringstream errString;
        errString << "Unable to locate the " << libName << " library; searched for ";
        std::copy(searchedLibs.begin(), searchedLibs.end(),
                  std::ostream_iterator<std::string>(errString, " "));

        helper::Throw<std::runtime_error>("Helper", "adiosDynamicBinder", "DynamicBinder",
                                          errString.str());
    }
}